

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

bool embree::avx512::
     BVHNIntersectorKHybrid<8,_4,_1,_false,_embree::avx512::ArrayIntersectorK_1<4,_embree::avx512::QuadMvIntersectorKMoeller<4,_4,_true>_>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<4> *ray
                ,TravRayK<4,_false> *tray,RayQueryContext *context)

{
  undefined4 uVar1;
  float fVar2;
  undefined1 auVar3 [16];
  Geometry *pGVar4;
  RTCFilterFunctionN p_Var5;
  bool bVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  long lVar11;
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  ulong uVar16;
  long lVar17;
  uint uVar18;
  ulong uVar19;
  ulong *puVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  undefined1 auVar27 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  float fVar42;
  float fVar44;
  float fVar45;
  float fVar46;
  undefined1 auVar43 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  float fVar54;
  float fVar55;
  float fVar56;
  undefined1 auVar52 [32];
  undefined1 auVar53 [64];
  undefined1 auVar57 [32];
  undefined1 auVar58 [64];
  undefined1 auVar59 [64];
  undefined1 auVar60 [64];
  undefined1 auVar61 [64];
  undefined1 auVar62 [64];
  undefined1 auVar63 [64];
  undefined1 auVar64 [64];
  undefined1 auVar65 [64];
  undefined1 auVar66 [64];
  undefined1 auVar67 [64];
  undefined1 auVar68 [64];
  undefined1 in_ZMM31 [64];
  undefined1 auVar69 [64];
  RTCFilterFunctionNArguments args;
  float old_t;
  NodeRef stack [564];
  ulong *local_1688;
  undefined1 local_1650 [16];
  long local_1638;
  long local_1630;
  ulong local_1628;
  Scene *local_1620;
  ulong local_1618;
  RTCFilterFunctionNArguments local_1610;
  undefined1 local_15e0 [16];
  RTCHitN local_15d0 [16];
  undefined1 local_15c0 [16];
  undefined1 local_15b0 [16];
  undefined1 local_15a0 [16];
  undefined1 local_1590 [16];
  undefined1 local_1580 [16];
  undefined1 local_1570 [16];
  uint local_1560;
  uint uStack_155c;
  uint uStack_1558;
  uint uStack_1554;
  uint uStack_1550;
  uint uStack_154c;
  uint uStack_1548;
  uint uStack_1544;
  undefined1 local_1540 [32];
  undefined1 local_1520 [32];
  undefined1 local_1500 [32];
  undefined1 local_14e0 [32];
  undefined1 local_14c0 [32];
  undefined1 local_14a0 [32];
  undefined1 local_1480 [32];
  undefined1 local_1460 [32];
  undefined1 local_1440 [32];
  undefined8 local_1420;
  undefined8 uStack_1418;
  undefined8 uStack_1410;
  undefined8 uStack_1408;
  undefined8 local_1400;
  undefined8 uStack_13f8;
  undefined8 uStack_13f0;
  undefined8 uStack_13e8;
  undefined1 local_13e0 [32];
  undefined1 local_13c0 [32];
  undefined1 local_13a0 [32];
  undefined1 local_1380 [32];
  undefined1 local_1360 [32];
  undefined1 local_1340 [32];
  undefined1 local_1320 [32];
  byte local_1300;
  undefined1 local_12e0 [32];
  undefined1 local_12c0 [32];
  float local_12a0 [4];
  float fStack_1290;
  float fStack_128c;
  float fStack_1288;
  float fStack_1284;
  undefined1 local_1280 [32];
  undefined1 local_1260 [32];
  undefined1 local_1240 [32];
  undefined1 local_1220;
  size_t local_1200;
  ulong local_11f8 [569];
  
  local_1200 = root.ptr;
  auVar28 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->rdir).field_0 + k * 4)));
  auVar58 = ZEXT3264(auVar28);
  auVar29 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->rdir).field_0 + k * 4 + 0x10)));
  auVar59 = ZEXT3264(auVar29);
  auVar30 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->rdir).field_0 + k * 4 + 0x20)));
  auVar60 = ZEXT3264(auVar30);
  auVar25 = vmulss_avx512f(auVar28._0_16_,ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4)));
  auVar26 = vmulss_avx512f(auVar29._0_16_,
                           ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4 + 0x10)));
  auVar29._0_4_ = auVar25._0_4_;
  auVar29._4_4_ = auVar29._0_4_;
  auVar29._8_4_ = auVar29._0_4_;
  auVar29._12_4_ = auVar29._0_4_;
  auVar29._16_4_ = auVar29._0_4_;
  auVar29._20_4_ = auVar29._0_4_;
  auVar29._24_4_ = auVar29._0_4_;
  auVar29._28_4_ = auVar29._0_4_;
  auVar41._0_4_ = auVar26._0_4_;
  auVar41._4_4_ = auVar41._0_4_;
  auVar41._8_4_ = auVar41._0_4_;
  auVar41._12_4_ = auVar41._0_4_;
  auVar41._16_4_ = auVar41._0_4_;
  auVar41._20_4_ = auVar41._0_4_;
  auVar41._24_4_ = auVar41._0_4_;
  auVar41._28_4_ = auVar41._0_4_;
  auVar25 = vmulss_avx512f(auVar30._0_16_,
                           ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4 + 0x20)));
  auVar30._0_4_ = auVar25._0_4_;
  auVar30._4_4_ = auVar30._0_4_;
  auVar30._8_4_ = auVar30._0_4_;
  auVar30._12_4_ = auVar30._0_4_;
  auVar30._16_4_ = auVar30._0_4_;
  auVar30._20_4_ = auVar30._0_4_;
  auVar30._24_4_ = auVar30._0_4_;
  auVar30._28_4_ = auVar30._0_4_;
  local_1628 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar23 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar21 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  local_1618 = local_1628 ^ 0x20;
  auVar28 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
  auVar61 = ZEXT3264(auVar28);
  auVar29 = vxorps_avx512vl(auVar29,auVar28);
  auVar62 = ZEXT3264(auVar29);
  auVar29 = vxorps_avx512vl(auVar41,auVar28);
  auVar63 = ZEXT3264(auVar29);
  auVar28 = vxorps_avx512vl(auVar30,auVar28);
  auVar64 = ZEXT3264(auVar28);
  auVar28 = vpbroadcastd_avx512vl(ZEXT416((uint)(tray->tnear).field_0.i[k]));
  auVar65 = ZEXT3264(auVar28);
  auVar28 = vpbroadcastd_avx512vl(ZEXT416((uint)(tray->tfar).field_0.i[k]));
  auVar66 = ZEXT3264(auVar28);
  auVar25 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  auVar67 = ZEXT1664(auVar25);
  auVar28 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar68 = ZEXT3264(auVar28);
  auVar25 = vxorps_avx512vl(in_ZMM31._0_16_,in_ZMM31._0_16_);
  auVar69 = ZEXT1664(auVar25);
  local_1688 = local_11f8;
LAB_01da78d9:
  do {
    puVar20 = local_1688;
    if (puVar20 == &local_1200) {
LAB_01da804d:
      return puVar20 != &local_1200;
    }
    local_1688 = puVar20 + -1;
    uVar22 = puVar20[-1];
    while ((uVar22 & 8) == 0) {
      auVar28 = vfmadd132ps_avx512vl
                          (*(undefined1 (*) [32])(uVar22 + 0x40 + local_1628),auVar62._0_32_,
                           auVar58._0_32_);
      auVar29 = vfmadd132ps_avx512vl
                          (*(undefined1 (*) [32])(uVar22 + 0x40 + uVar23),auVar63._0_32_,
                           auVar59._0_32_);
      auVar28 = vpmaxsd_avx2(auVar28,auVar29);
      auVar29 = vfmadd132ps_avx512vl
                          (*(undefined1 (*) [32])(uVar22 + 0x40 + uVar21),auVar64._0_32_,
                           auVar60._0_32_);
      auVar29 = vpmaxsd_avx512vl(auVar29,auVar65._0_32_);
      auVar28 = vpmaxsd_avx2(auVar28,auVar29);
      auVar29 = vfmadd132ps_avx512vl
                          (*(undefined1 (*) [32])(uVar22 + 0x40 + local_1618),auVar62._0_32_,
                           auVar58._0_32_);
      auVar30 = vfmadd132ps_avx512vl
                          (*(undefined1 (*) [32])(uVar22 + 0x40 + (uVar23 ^ 0x20)),auVar63._0_32_,
                           auVar59._0_32_);
      auVar29 = vpminsd_avx2(auVar29,auVar30);
      auVar30 = vfmadd132ps_avx512vl
                          (*(undefined1 (*) [32])(uVar22 + 0x40 + (uVar21 ^ 0x20)),auVar64._0_32_,
                           auVar60._0_32_);
      auVar30 = vpminsd_avx512vl(auVar30,auVar66._0_32_);
      auVar29 = vpminsd_avx2(auVar29,auVar30);
      uVar19 = vpcmpd_avx512vl(auVar28,auVar29,2);
      if ((char)uVar19 == '\0') goto LAB_01da78d9;
      uVar16 = uVar22 & 0xfffffffffffffff0;
      lVar11 = 0;
      for (uVar22 = uVar19; (uVar22 & 1) == 0; uVar22 = uVar22 >> 1 | 0x8000000000000000) {
        lVar11 = lVar11 + 1;
      }
      uVar22 = *(ulong *)(uVar16 + lVar11 * 8);
      uVar18 = (uint)uVar19 - 1 & (uint)uVar19;
      uVar19 = (ulong)uVar18;
      if (uVar18 != 0) {
        do {
          *local_1688 = uVar22;
          local_1688 = local_1688 + 1;
          lVar11 = 0;
          for (uVar22 = uVar19; (uVar22 & 1) == 0; uVar22 = uVar22 >> 1 | 0x8000000000000000) {
            lVar11 = lVar11 + 1;
          }
          uVar19 = uVar19 - 1 & uVar19;
          uVar22 = *(ulong *)(uVar16 + lVar11 * 8);
        } while (uVar19 != 0);
      }
    }
    local_1630 = (ulong)((uint)uVar22 & 0xf) - 8;
    uVar22 = uVar22 & 0xfffffffffffffff0;
    for (local_1638 = 0; local_1638 != local_1630; local_1638 = local_1638 + 1) {
      lVar17 = local_1638 * 0xe0;
      lVar11 = uVar22 + 0xd0 + lVar17;
      local_1420 = *(undefined8 *)(lVar11 + 0x10);
      uStack_1418 = *(undefined8 *)(lVar11 + 0x18);
      lVar11 = uVar22 + 0xc0 + lVar17;
      local_1400 = *(undefined8 *)(lVar11 + 0x10);
      uStack_13f8 = *(undefined8 *)(lVar11 + 0x18);
      uStack_13f0 = local_1400;
      uStack_13e8 = uStack_13f8;
      uStack_1410 = local_1420;
      uStack_1408 = uStack_1418;
      auVar37._16_16_ = *(undefined1 (*) [16])(uVar22 + 0x60 + lVar17);
      auVar37._0_16_ = *(undefined1 (*) [16])(uVar22 + lVar17);
      auVar38._16_16_ = *(undefined1 (*) [16])(uVar22 + 0x70 + lVar17);
      auVar38._0_16_ = *(undefined1 (*) [16])(uVar22 + 0x10 + lVar17);
      auVar47._16_16_ = *(undefined1 (*) [16])(uVar22 + 0x80 + lVar17);
      auVar47._0_16_ = *(undefined1 (*) [16])(uVar22 + 0x20 + lVar17);
      auVar25 = *(undefined1 (*) [16])(uVar22 + 0x30 + lVar17);
      auVar28._16_16_ = auVar25;
      auVar28._0_16_ = auVar25;
      auVar26 = *(undefined1 (*) [16])(uVar22 + 0x40 + lVar17);
      auVar40._16_16_ = auVar26;
      auVar40._0_16_ = auVar26;
      auVar27 = *(undefined1 (*) [16])(uVar22 + 0x50 + lVar17);
      auVar39._16_16_ = auVar27;
      auVar39._0_16_ = auVar27;
      auVar3 = *(undefined1 (*) [16])(uVar22 + 0x90 + lVar17);
      auVar48._16_16_ = auVar3;
      auVar48._0_16_ = auVar3;
      auVar3 = *(undefined1 (*) [16])(uVar22 + 0xa0 + lVar17);
      auVar49._16_16_ = auVar3;
      auVar49._0_16_ = auVar3;
      auVar3 = *(undefined1 (*) [16])(uVar22 + 0xb0 + lVar17);
      auVar50._16_16_ = auVar3;
      auVar50._0_16_ = auVar3;
      auVar28 = vsubps_avx(auVar37,auVar28);
      auVar29 = vsubps_avx(auVar38,auVar40);
      auVar30 = vsubps_avx(auVar47,auVar39);
      auVar41 = vsubps_avx(auVar48,auVar37);
      auVar40 = vsubps_avx(auVar49,auVar38);
      auVar39 = vsubps_avx(auVar50,auVar47);
      auVar31._4_4_ = auVar29._4_4_ * auVar39._4_4_;
      auVar31._0_4_ = auVar29._0_4_ * auVar39._0_4_;
      auVar31._8_4_ = auVar29._8_4_ * auVar39._8_4_;
      auVar31._12_4_ = auVar29._12_4_ * auVar39._12_4_;
      auVar31._16_4_ = auVar29._16_4_ * auVar39._16_4_;
      auVar31._20_4_ = auVar29._20_4_ * auVar39._20_4_;
      auVar31._24_4_ = auVar29._24_4_ * auVar39._24_4_;
      auVar31._28_4_ = auVar25._12_4_;
      auVar3 = vfmsub231ps_fma(auVar31,auVar40,auVar30);
      auVar32._4_4_ = auVar30._4_4_ * auVar41._4_4_;
      auVar32._0_4_ = auVar30._0_4_ * auVar41._0_4_;
      auVar32._8_4_ = auVar30._8_4_ * auVar41._8_4_;
      auVar32._12_4_ = auVar30._12_4_ * auVar41._12_4_;
      auVar32._16_4_ = auVar30._16_4_ * auVar41._16_4_;
      auVar32._20_4_ = auVar30._20_4_ * auVar41._20_4_;
      auVar32._24_4_ = auVar30._24_4_ * auVar41._24_4_;
      auVar32._28_4_ = auVar26._12_4_;
      auVar26 = vfmsub231ps_fma(auVar32,auVar39,auVar28);
      auVar36._4_4_ = auVar28._4_4_ * auVar40._4_4_;
      auVar36._0_4_ = auVar28._0_4_ * auVar40._0_4_;
      auVar36._8_4_ = auVar28._8_4_ * auVar40._8_4_;
      auVar36._12_4_ = auVar28._12_4_ * auVar40._12_4_;
      auVar36._16_4_ = auVar28._16_4_ * auVar40._16_4_;
      auVar36._20_4_ = auVar28._20_4_ * auVar40._20_4_;
      auVar36._24_4_ = auVar28._24_4_ * auVar40._24_4_;
      auVar36._28_4_ = auVar27._12_4_;
      uVar1 = *(undefined4 *)(ray + k * 4 + 0x40);
      auVar52._4_4_ = uVar1;
      auVar52._0_4_ = uVar1;
      auVar52._8_4_ = uVar1;
      auVar52._12_4_ = uVar1;
      auVar52._16_4_ = uVar1;
      auVar52._20_4_ = uVar1;
      auVar52._24_4_ = uVar1;
      auVar52._28_4_ = uVar1;
      auVar31 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x50)));
      auVar32 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x60)));
      uVar1 = *(undefined4 *)(ray + k * 4);
      auVar33._4_4_ = uVar1;
      auVar33._0_4_ = uVar1;
      auVar33._8_4_ = uVar1;
      auVar33._12_4_ = uVar1;
      auVar33._16_4_ = uVar1;
      auVar33._20_4_ = uVar1;
      auVar33._24_4_ = uVar1;
      auVar33._28_4_ = uVar1;
      auVar33 = vsubps_avx512vl(auVar37,auVar33);
      auVar27 = vfmsub231ps_fma(auVar36,auVar41,auVar29);
      uVar1 = *(undefined4 *)(ray + k * 4 + 0x10);
      auVar34._4_4_ = uVar1;
      auVar34._0_4_ = uVar1;
      auVar34._8_4_ = uVar1;
      auVar34._12_4_ = uVar1;
      auVar34._16_4_ = uVar1;
      auVar34._20_4_ = uVar1;
      auVar34._24_4_ = uVar1;
      auVar34._28_4_ = uVar1;
      auVar34 = vsubps_avx512vl(auVar38,auVar34);
      uVar1 = *(undefined4 *)(ray + k * 4 + 0x20);
      auVar35._4_4_ = uVar1;
      auVar35._0_4_ = uVar1;
      auVar35._8_4_ = uVar1;
      auVar35._12_4_ = uVar1;
      auVar35._16_4_ = uVar1;
      auVar35._20_4_ = uVar1;
      auVar35._24_4_ = uVar1;
      auVar35._28_4_ = uVar1;
      auVar35 = vsubps_avx512vl(auVar47,auVar35);
      auVar36 = vmulps_avx512vl(auVar31,auVar35);
      auVar36 = vfmsub231ps_avx512vl(auVar36,auVar34,auVar32);
      auVar37 = vmulps_avx512vl(auVar32,auVar33);
      auVar37 = vfmsub231ps_avx512vl(auVar37,auVar35,auVar52);
      auVar38 = vmulps_avx512vl(auVar52,auVar34);
      auVar38 = vfmsub231ps_avx512vl(auVar38,auVar33,auVar31);
      auVar32 = vmulps_avx512vl(ZEXT1632(auVar27),auVar32);
      auVar31 = vfmadd231ps_avx512vl(auVar32,ZEXT1632(auVar26),auVar31);
      local_1380 = vfmadd231ps_avx512vl(auVar31,ZEXT1632(auVar3),auVar52);
      vandps_avx512vl(local_1380,auVar68._0_32_);
      vandps_avx512vl(local_1380,auVar61._0_32_);
      auVar39 = vmulps_avx512vl(auVar39,auVar38);
      auVar40 = vfmadd231ps_avx512vl(auVar39,auVar37,auVar40);
      auVar25 = vfmadd231ps_fma(auVar40,auVar36,auVar41);
      fVar42 = local_1380._0_4_;
      local_13e0._0_4_ = (float)((uint)fVar42 ^ auVar25._0_4_);
      fVar44 = local_1380._4_4_;
      local_13e0._4_4_ = (float)((uint)fVar44 ^ auVar25._4_4_);
      fVar45 = local_1380._8_4_;
      local_13e0._8_4_ = (float)((uint)fVar45 ^ auVar25._8_4_);
      fVar46 = local_1380._12_4_;
      local_13e0._12_4_ = (float)((uint)fVar46 ^ auVar25._12_4_);
      fVar54 = local_1380._16_4_;
      local_13e0._16_4_ = fVar54;
      fVar55 = local_1380._20_4_;
      local_13e0._20_4_ = fVar55;
      fVar56 = local_1380._24_4_;
      local_13e0._24_4_ = fVar56;
      fStack_1284 = local_1380._28_4_;
      local_13e0._28_4_ = fStack_1284;
      auVar30 = vmulps_avx512vl(auVar30,auVar38);
      auVar29 = vfmadd231ps_avx512vl(auVar30,auVar29,auVar37);
      auVar25 = vfmadd231ps_fma(auVar29,auVar28,auVar36);
      local_13c0._0_4_ = (float)((uint)fVar42 ^ auVar25._0_4_);
      local_13c0._4_4_ = (float)((uint)fVar44 ^ auVar25._4_4_);
      local_13c0._8_4_ = (float)((uint)fVar45 ^ auVar25._8_4_);
      local_13c0._12_4_ = (float)((uint)fVar46 ^ auVar25._12_4_);
      local_13c0._16_4_ = fVar54;
      local_13c0._20_4_ = fVar55;
      local_13c0._24_4_ = fVar56;
      local_13c0._28_4_ = fStack_1284;
      auVar28 = auVar69._0_32_;
      uVar7 = vcmpps_avx512vl(local_13e0,auVar28,5);
      uVar8 = vcmpps_avx512vl(local_13c0,auVar28,5);
      uVar9 = vcmpps_avx512vl(local_1380,auVar28,4);
      auVar57._0_4_ = local_13e0._0_4_ + local_13c0._0_4_;
      auVar57._4_4_ = local_13e0._4_4_ + local_13c0._4_4_;
      auVar57._8_4_ = local_13e0._8_4_ + local_13c0._8_4_;
      auVar57._12_4_ = local_13e0._12_4_ + local_13c0._12_4_;
      auVar57._16_4_ = fVar54 + fVar54;
      auVar57._20_4_ = fVar55 + fVar55;
      auVar57._24_4_ = fVar56 + fVar56;
      auVar57._28_4_ = fStack_1284 + fStack_1284;
      uVar10 = vcmpps_avx512vl(auVar57,local_1380,2);
      local_1300 = (byte)uVar7 & (byte)uVar8 & (byte)uVar9 & (byte)uVar10;
      if (local_1300 != 0) {
        auVar13._4_4_ = auVar35._4_4_ * auVar27._4_4_;
        auVar13._0_4_ = auVar35._0_4_ * auVar27._0_4_;
        auVar13._8_4_ = auVar35._8_4_ * auVar27._8_4_;
        auVar13._12_4_ = auVar35._12_4_ * auVar27._12_4_;
        auVar13._16_4_ = auVar35._16_4_ * 0.0;
        auVar13._20_4_ = auVar35._20_4_ * 0.0;
        auVar13._24_4_ = auVar35._24_4_ * 0.0;
        auVar13._28_4_ = auVar35._28_4_;
        auVar25 = vfmadd213ps_fma(auVar34,ZEXT1632(auVar26),auVar13);
        auVar25 = vfmadd213ps_fma(auVar33,ZEXT1632(auVar3),ZEXT1632(auVar25));
        local_13a0._0_4_ = (float)((uint)fVar42 ^ auVar25._0_4_);
        local_13a0._4_4_ = (float)((uint)fVar44 ^ auVar25._4_4_);
        local_13a0._8_4_ = (float)((uint)fVar45 ^ auVar25._8_4_);
        local_13a0._12_4_ = (float)((uint)fVar46 ^ auVar25._12_4_);
        local_13a0._16_4_ = fVar54;
        local_13a0._20_4_ = fVar55;
        local_13a0._24_4_ = fVar56;
        local_13a0._28_4_ = fStack_1284;
        uVar1 = *(undefined4 *)(ray + k * 4 + 0x30);
        auVar12._4_4_ = uVar1;
        auVar12._0_4_ = uVar1;
        auVar12._8_4_ = uVar1;
        auVar12._12_4_ = uVar1;
        auVar12._16_4_ = uVar1;
        auVar12._20_4_ = uVar1;
        auVar12._24_4_ = uVar1;
        auVar12._28_4_ = uVar1;
        auVar28 = vmulps_avx512vl(local_1380,auVar12);
        uVar7 = vcmpps_avx512vl(auVar28,local_13a0,1);
        fVar2 = *(float *)(ray + k * 4 + 0x80);
        auVar53 = ZEXT3264(CONCAT428(fVar2,CONCAT424(fVar2,CONCAT420(fVar2,CONCAT416(fVar2,CONCAT412
                                                  (fVar2,CONCAT48(fVar2,CONCAT44(fVar2,fVar2))))))))
        ;
        auVar14._4_4_ = fVar2 * fVar44;
        auVar14._0_4_ = fVar2 * fVar42;
        auVar14._8_4_ = fVar2 * fVar45;
        auVar14._12_4_ = fVar2 * fVar46;
        auVar14._16_4_ = fVar2 * fVar54;
        auVar14._20_4_ = fVar2 * fVar55;
        auVar14._24_4_ = fVar2 * fVar56;
        auVar14._28_4_ = auVar28._28_4_;
        uVar8 = vcmpps_avx512vl(local_13a0,auVar14,2);
        local_1300 = (byte)uVar7 & (byte)uVar8 & local_1300;
        if (local_1300 != 0) {
          local_1360 = ZEXT1632(auVar3);
          local_1340 = ZEXT1632(auVar26);
          local_1320 = ZEXT1632(auVar27);
          local_1220 = 0xf0;
          local_1620 = context->scene;
          auVar28 = vrcp14ps_avx512vl(local_1380);
          auVar51._8_4_ = 0x3f800000;
          auVar51._0_8_ = 0x3f8000003f800000;
          auVar51._12_4_ = 0x3f800000;
          auVar51._16_4_ = 0x3f800000;
          auVar51._20_4_ = 0x3f800000;
          auVar51._24_4_ = 0x3f800000;
          auVar51._28_4_ = 0x3f800000;
          auVar25 = vfnmadd213ps_fma(local_1380,auVar28,auVar51);
          auVar25 = vfmadd132ps_fma(ZEXT1632(auVar25),auVar28,auVar28);
          fVar42 = auVar25._0_4_;
          fVar44 = auVar25._4_4_;
          fVar45 = auVar25._8_4_;
          fVar46 = auVar25._12_4_;
          local_12a0[0] = fVar42 * local_13a0._0_4_;
          local_12a0[1] = fVar44 * local_13a0._4_4_;
          local_12a0[2] = fVar45 * local_13a0._8_4_;
          local_12a0[3] = fVar46 * local_13a0._12_4_;
          fStack_1290 = fVar54 * 0.0;
          fStack_128c = fVar55 * 0.0;
          fStack_1288 = fVar56 * 0.0;
          auVar15._4_4_ = fVar44 * local_13e0._4_4_;
          auVar15._0_4_ = fVar42 * local_13e0._0_4_;
          auVar15._8_4_ = fVar45 * local_13e0._8_4_;
          auVar15._12_4_ = fVar46 * local_13e0._12_4_;
          auVar15._16_4_ = fVar54 * 0.0;
          auVar15._20_4_ = fVar55 * 0.0;
          auVar15._24_4_ = fVar56 * 0.0;
          auVar15._28_4_ = fStack_1284;
          auVar28 = vminps_avx(auVar15,auVar51);
          auVar43._0_4_ = fVar42 * local_13c0._0_4_;
          auVar43._4_4_ = fVar44 * local_13c0._4_4_;
          auVar43._8_4_ = fVar45 * local_13c0._8_4_;
          auVar43._12_4_ = fVar46 * local_13c0._12_4_;
          auVar43._16_4_ = fVar54 * 0.0;
          auVar43._20_4_ = fVar55 * 0.0;
          auVar43._24_4_ = fVar56 * 0.0;
          auVar43._28_4_ = 0;
          auVar29 = vminps_avx(auVar43,auVar51);
          auVar30 = vsubps_avx(auVar51,auVar28);
          auVar41 = vsubps_avx(auVar51,auVar29);
          local_12c0 = vblendps_avx(auVar29,auVar30,0xf0);
          local_12e0 = vblendps_avx(auVar28,auVar41,0xf0);
          fVar42 = (float)DAT_01fbac00;
          local_1280._0_4_ = auVar3._0_4_ * fVar42;
          fVar44 = DAT_01fbac00._4_4_;
          local_1280._4_4_ = auVar3._4_4_ * fVar44;
          fVar45 = DAT_01fbac00._8_4_;
          local_1280._8_4_ = auVar3._8_4_ * fVar45;
          fVar46 = DAT_01fbac00._12_4_;
          local_1280._12_4_ = auVar3._12_4_ * fVar46;
          fVar54 = DAT_01fbac00._16_4_;
          local_1280._16_4_ = fVar54 * 0.0;
          fVar55 = DAT_01fbac00._20_4_;
          local_1280._20_4_ = fVar55 * 0.0;
          fVar56 = DAT_01fbac00._24_4_;
          local_1280._24_4_ = fVar56 * 0.0;
          local_1280._28_4_ = 0;
          local_1260._0_4_ = auVar26._0_4_ * fVar42;
          local_1260._4_4_ = auVar26._4_4_ * fVar44;
          local_1260._8_4_ = auVar26._8_4_ * fVar45;
          local_1260._12_4_ = auVar26._12_4_ * fVar46;
          local_1260._16_4_ = fVar54 * 0.0;
          local_1260._20_4_ = fVar55 * 0.0;
          local_1260._24_4_ = fVar56 * 0.0;
          local_1260._28_4_ = 0;
          local_1240._4_4_ = auVar27._4_4_ * fVar44;
          local_1240._0_4_ = auVar27._0_4_ * fVar42;
          local_1240._8_4_ = auVar27._8_4_ * fVar45;
          local_1240._12_4_ = auVar27._12_4_ * fVar46;
          local_1240._16_4_ = fVar54 * 0.0;
          local_1240._20_4_ = fVar55 * 0.0;
          local_1240._24_4_ = fVar56 * 0.0;
          local_1240._28_4_ = 0;
          uVar19 = (ulong)local_1300;
          do {
            auVar25 = auVar69._0_16_;
            uVar16 = 0;
            for (uVar24 = uVar19; (uVar24 & 1) == 0; uVar24 = uVar24 >> 1 | 0x8000000000000000) {
              uVar16 = uVar16 + 1;
            }
            pGVar4 = (local_1620->geometries).items[*(uint *)((long)&local_1400 + uVar16 * 4)].ptr;
            if ((pGVar4->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                 (pGVar4->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
LAB_01da8041:
                *(undefined4 *)(ray + k * 4 + 0x80) = 0xff800000;
                goto LAB_01da804d;
              }
              local_1540 = auVar53._0_32_;
              local_1520 = vmovdqa64_avx512vl(auVar66._0_32_);
              local_1500 = vmovdqa64_avx512vl(auVar65._0_32_);
              local_14e0 = auVar64._0_32_;
              local_14c0 = auVar63._0_32_;
              local_14a0 = auVar62._0_32_;
              local_1480 = auVar60._0_32_;
              local_1460 = auVar59._0_32_;
              local_1440 = auVar58._0_32_;
              uVar24 = (ulong)(uint)((int)uVar16 * 4);
              uVar1 = *(undefined4 *)(local_12e0 + uVar24);
              local_15a0._4_4_ = uVar1;
              local_15a0._0_4_ = uVar1;
              local_15a0._8_4_ = uVar1;
              local_15a0._12_4_ = uVar1;
              uVar1 = *(undefined4 *)(local_12c0 + uVar24);
              local_1590._4_4_ = uVar1;
              local_1590._0_4_ = uVar1;
              local_1590._8_4_ = uVar1;
              local_1590._12_4_ = uVar1;
              *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)((long)local_12a0 + uVar24);
              local_1610.context = context->user;
              local_1570 = vpbroadcastd_avx512vl();
              uVar1 = *(undefined4 *)((long)&local_1420 + uVar24);
              local_1580._4_4_ = uVar1;
              local_1580._0_4_ = uVar1;
              local_1580._8_4_ = uVar1;
              local_1580._12_4_ = uVar1;
              uVar1 = *(undefined4 *)(local_1280 + uVar24);
              local_15d0._4_4_ = uVar1;
              local_15d0._0_4_ = uVar1;
              local_15d0._8_4_ = uVar1;
              local_15d0._12_4_ = uVar1;
              uVar1 = *(undefined4 *)(local_1260 + uVar24);
              local_15c0._4_4_ = uVar1;
              local_15c0._0_4_ = uVar1;
              local_15c0._8_4_ = uVar1;
              local_15c0._12_4_ = uVar1;
              uVar1 = *(undefined4 *)(local_1240 + uVar24);
              local_15b0._4_4_ = uVar1;
              local_15b0._0_4_ = uVar1;
              local_15b0._8_4_ = uVar1;
              local_15b0._12_4_ = uVar1;
              vpcmpeqd_avx2(ZEXT1632(local_1570),ZEXT1632(local_1570));
              uStack_155c = (local_1610.context)->instID[0];
              local_1560 = uStack_155c;
              uStack_1558 = uStack_155c;
              uStack_1554 = uStack_155c;
              uStack_1550 = (local_1610.context)->instPrimID[0];
              uStack_154c = uStack_1550;
              uStack_1548 = uStack_1550;
              uStack_1544 = uStack_1550;
              auVar26 = auVar67._0_16_;
              local_1650 = vmovdqa64_avx512vl(auVar26);
              local_1610.valid = (int *)local_1650;
              local_1610.geometryUserPtr = pGVar4->userPtr;
              local_1610.hit = local_15d0;
              local_1610.N = 4;
              local_15e0 = vmovdqa64_avx512vl(auVar26);
              auVar26 = vmovdqa64_avx512vl(auVar26);
              local_1610.ray = (RTCRayN *)ray;
              if (pGVar4->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                (*pGVar4->occlusionFilterN)(&local_1610);
                auVar26 = local_1650;
              }
              uVar24 = vptestmd_avx512vl(auVar26,auVar26);
              if ((uVar24 & 0xf) != 0) {
                p_Var5 = context->args->filter;
                if ((p_Var5 != (RTCFilterFunctionN)0x0) &&
                   (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                     RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar4->field_8).field_0x2 & 0x40) != 0))))
                {
                  (*p_Var5)(&local_1610);
                  auVar26 = local_1650;
                }
                uVar24 = vptestmd_avx512vl(auVar26,auVar26);
                uVar24 = uVar24 & 0xf;
                auVar26 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                bVar6 = (bool)((byte)uVar24 & 1);
                auVar27._0_4_ =
                     (uint)bVar6 * auVar26._0_4_ | (uint)!bVar6 * *(int *)(local_1610.ray + 0x80);
                bVar6 = (bool)((byte)(uVar24 >> 1) & 1);
                auVar27._4_4_ =
                     (uint)bVar6 * auVar26._4_4_ | (uint)!bVar6 * *(int *)(local_1610.ray + 0x84);
                bVar6 = (bool)((byte)(uVar24 >> 2) & 1);
                auVar27._8_4_ =
                     (uint)bVar6 * auVar26._8_4_ | (uint)!bVar6 * *(int *)(local_1610.ray + 0x88);
                bVar6 = SUB81(uVar24 >> 3,0);
                auVar27._12_4_ =
                     (uint)bVar6 * auVar26._12_4_ | (uint)!bVar6 * *(int *)(local_1610.ray + 0x8c);
                *(undefined1 (*) [16])(local_1610.ray + 0x80) = auVar27;
                if ((byte)uVar24 != 0) goto LAB_01da8041;
              }
              auVar53 = ZEXT3264(local_1540);
              *(int *)(ray + k * 4 + 0x80) = local_1540._0_4_;
              auVar58 = ZEXT3264(local_1440);
              auVar59 = ZEXT3264(local_1460);
              auVar60 = ZEXT3264(local_1480);
              auVar28 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
              auVar61 = ZEXT3264(auVar28);
              auVar62 = ZEXT3264(local_14a0);
              auVar63 = ZEXT3264(local_14c0);
              auVar64 = ZEXT3264(local_14e0);
              auVar28 = vmovdqa64_avx512vl(local_1500);
              auVar65 = ZEXT3264(auVar28);
              auVar28 = vmovdqa64_avx512vl(local_1520);
              auVar66 = ZEXT3264(auVar28);
              auVar26 = vmovdqa64_avx512vl(local_15e0);
              auVar67 = ZEXT1664(auVar26);
              auVar28 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
              auVar68 = ZEXT3264(auVar28);
              auVar25 = vxorps_avx512vl(auVar25,auVar25);
              auVar69 = ZEXT1664(auVar25);
            }
            uVar19 = uVar19 ^ 1L << (uVar16 & 0x3f);
          } while (uVar19 != 0);
        }
      }
    }
  } while( true );
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }